

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::Logger::resolveLoggerFormatSpec(Logger *this)

{
  anon_class_16_2_455e6bc1 local_48;
  function<bool_()> local_38;
  EnumType local_12;
  Logger *pLStack_10;
  EnumType lIndex;
  Logger *this_local;
  
  local_12 = 2;
  local_48.this = this;
  local_48.lIndex = &local_12;
  pLStack_10 = this;
  std::function<bool()>::function<el::Logger::resolveLoggerFormatSpec()const::_lambda()_1_,void>
            ((function<bool()> *)&local_38,&local_48);
  LevelHelper::forEachLevel(&local_12,&local_38);
  std::function<bool_()>::~function(&local_38);
  return;
}

Assistant:

void resolveLoggerFormatSpec(void) const {
        base::type::EnumType lIndex = LevelHelper::kMinValid;
        LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
            base::LogFormat* logFormat = 
                const_cast<base::LogFormat*>(&m_typedConfigurations->logFormat(LevelHelper::castFromInt(lIndex)));
            base::utils::Str::replaceFirstWithEscape(logFormat->m_format, base::consts::kLoggerIdFormatSpecifier, m_id);
            return false;
        });
    }